

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

pair<double,_double> __thiscall
imrt::EvaluationFunction::get_value_cost
          (EvaluationFunction *this,int angle,int b,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  iterator iVar4;
  Matrix *pMVar5;
  _Base_ptr p_Var6;
  long lVar7;
  double dVar8;
  pair<double,_double> pVar9;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  double local_88;
  double local_80;
  key_type local_68;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  
  local_68.second = b;
  local_68.first = angle;
  iVar4 = std::
          _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->beamlet2voxel_list)._M_h,&local_68);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
                       ._M_cur + 0x10));
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_60._M_impl.super__Rb_tree_header) {
    local_88 = 0.0;
    local_80 = 0.0;
  }
  else {
    local_88 = 0.0;
    local_80 = 0.0;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      iVar3 = *(int *)&p_Var6[1]._M_parent;
      lVar7 = (long)*(int *)((long)&p_Var6[1]._M_parent + 4);
      pMVar5 = Volume::getDepositionMatrix
                         ((this->volumes->
                          super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar3,angle);
      dVar2 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        pdVar1 = (double *)
                 (*(long *)&(this->Z).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + lVar7 * 8);
        dVar8 = local_88;
        if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
          local_80 = local_80 + pMVar5->p[lVar7][b];
        }
      }
      else {
        dVar8 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar3] -
                *(double *)
                 (*(long *)&(this->Z).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + lVar7 * 8);
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar8 = pMVar5->p[lVar7][b] / dVar8;
          if (local_88 < dVar8) goto LAB_001189ed;
        }
        else {
          local_88 = 1e+20;
        }
        dVar8 = local_88;
      }
LAB_001189ed:
      local_88 = dVar8;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&local_60);
  pVar9.second = local_88;
  pVar9.first = local_80;
  return pVar9;
}

Assistant:

pair<double,double> EvaluationFunction::get_value_cost(int angle, int b, vector<double>& Zmin, vector<double>& Zmax){
	multimap<double, pair<int,int> > voxels = beamlet2voxel_list.at(make_pair(angle,b));
	double cost=0.0, value=0.0;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 if(Zmin[o]==0.0){//organ
			 if(Zmax[o]-Z[o][k] == 0) cost=1e20;
			 else{
				 double c=Dep(k,b)/(Zmax[o]-Z[o][k]);
			 	 if(c>cost) cost=c;
			 }
		 }else
			 if(Z[o][k] < Zmin[o]) value += Dep(k,b);
	 }

	 return make_pair(value,cost);
}